

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::null_scoped_padder>::format
          (source_funcname_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  size_t sVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  memory_buf_t *in_RDI;
  null_scoped_padder p;
  size_t text_size;
  null_scoped_padder p_1;
  size_t local_68;
  string_view_t in_stack_ffffffffffffffa8;
  null_scoped_padder local_41;
  size_t local_40;
  null_scoped_padder local_31;
  memory_buf_t *local_30;
  long local_20;
  undefined8 local_10;
  undefined1 *local_8;
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    null_scoped_padder::null_scoped_padder
              (&local_31,0,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_30);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)&(in_RDI->super_buffer<char>).ptr_);
    if (bVar1) {
      local_68 = std::char_traits<char>::length((char_type *)0x221409);
    }
    else {
      local_68 = 0;
    }
    local_40 = local_68;
    null_scoped_padder::null_scoped_padder
              (&local_41,local_68,(padding_info *)&(in_RDI->super_buffer<char>).ptr_,local_30);
    local_10 = *(undefined8 *)(local_20 + 0x48);
    local_8 = &stack0xffffffffffffffa8;
    sVar2 = std::char_traits<char>::length((char_type *)0x221474);
    fmt_helper::append_string_view(in_stack_ffffffffffffffa8,in_RDI);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        size_t text_size =
            padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }